

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Client::create_client(Client *this)

{
  std::operator<<((ostream *)&std::cout,"\nEnter Client\'s id :");
  std::istream::operator>>(&std::cin,&this->id);
  std::operator<<((ostream *)&std::cout,"\nEnter the Client\'s Name :");
  std::istream::ignore();
  std::istream::getline((char *)&std::cin,(long)this);
  std::operator<<((ostream *)&std::cout,"\nEnter The Client Class : ");
  std::operator<<((ostream *)&std::cout,"\n\n\t\t\t\t\t1. Regular Client");
  std::operator<<((ostream *)&std::cout,"\n\n\t\t\t\t\t2. Golden Client");
  std::operator<<((ostream *)&std::cout,"\n\n\t\t\t\t\t3. VIP Client");
  std::operator<<((ostream *)&std::cout,"\n\n\t\t\t\t==>>Enter Your Choice: ");
  std::istream::operator>>(&std::cin,&this->client_class);
  std::operator<<((ostream *)&std::cout,"\nEnter Client\'s Birthdate (dd-mm-yyyy):");
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,this->bdate);
  std::operator<<((ostream *)&std::cout,"\nEnter The Type of Gender (m=0/f=1): ");
  std::istream::_M_extract<bool>((bool *)&std::cin);
  return;
}

Assistant:

void Client::create_client() {
    /*!
     * To add a client to the banking system we need to determine:
     * id: id of the client
     * name: client named
     * client_class: current class of the client
     * bdate: birthdate (dd-mm-yyyy) as a string value
     *
     */

    std::cout<<"\nEnter Client's id :";
    std::cin>>id;
    std::cout<<"\nEnter the Client's Name :";
    std::cin.ignore();
    std::cin.getline(name,49);
    std::cout<<"\nEnter The Client Class : ";
    std::cout<<"\n\n\t\t\t\t\t1. Regular Client";
    std::cout<<"\n\n\t\t\t\t\t2. Golden Client";
    std::cout<<"\n\n\t\t\t\t\t3. VIP Client";
    std::cout<<"\n\n\t\t\t\t==>>Enter Your Choice: ";
    std::cin>>client_class;
    std::cout<<"\nEnter Client's Birthdate (dd-mm-yyyy):";
    std::cin>>bdate;
    std::cout<<"\nEnter The Type of Gender (m=0/f=1): ";
    std::cin>>gender;

}